

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.cpp
# Opt level: O3

Error __thiscall asmjit::v1_14::FuncFrame::finalize(FuncFrame *this)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  undefined1 uVar4;
  RegMask RVar5;
  uint uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  Error EVar9;
  byte *pbVar10;
  uint *puVar11;
  InstHints *pIVar12;
  uint uVar13;
  byte bVar14;
  int iVar15;
  byte bVar16;
  FuncFrame *frame;
  FuncArgsAssignment *args;
  uint uVar17;
  int iVar18;
  uint32_t uVar19;
  byte bVar20;
  int iVar21;
  Iterator __begin2;
  RegGroup group;
  long lVar22;
  RAConstraints RStack_5d0;
  FuncArgsContext FStack_5b8;
  FuncFrame *pFStack_90;
  ulong uStack_88;
  code *pcStack_80;
  byte local_77;
  RegGroup local_76 [6];
  FuncAttributes local_70;
  uint local_6c;
  byte *local_68;
  Array<asmjit::v1_14::InstHints,_4UL> *local_60;
  uint32_t saveRestoreSizes [2];
  
  if ((byte)(this->_arch - k32BitMask) < 0x10) {
    lVar22 = (ulong)this->_arch * 0xd8;
    args = (FuncArgsAssignment *)&this->_saveRestoreRegSize;
    local_76[5] = 0;
    pcStack_80 = (code *)0x11ec67;
    pbVar10 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                        ((Array<unsigned_char,_4UL> *)args,local_76 + 5);
    bVar14 = *pbVar10;
    local_76[4] = 1;
    pcStack_80 = (code *)0x11ec7a;
    pbVar10 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                        ((Array<unsigned_char,_4UL> *)args,local_76 + 4);
    bVar1 = _archTraits[lVar22 + 2];
    uStack_88 = (ulong)bVar1;
    frame = (FuncFrame *)0x0;
    local_6c = (uint)bVar14;
    if (bVar1 == 0xff) {
      frame = (FuncFrame *)(ulong)local_6c;
    }
    bVar14 = this->_callStackAlignment;
    if (this->_callStackAlignment < this->_naturalStackAlignment) {
      bVar14 = this->_naturalStackAlignment;
    }
    bVar2 = this->_finalStackAlignment;
    uVar4 = this->_localStackAlignment;
    if (bVar14 <= (byte)uVar4) {
      bVar14 = uVar4;
    }
    if (bVar2 != bVar14) {
      pcStack_80 = FuncArgsAssignment::updateFuncFrame;
      finalize();
      if (*(long *)args != 0) {
        RStack_5d0._availableRegs._data[0] = 0;
        RStack_5d0._availableRegs._data[1] = 0;
        RStack_5d0._availableRegs._data[2] = 0;
        RStack_5d0._availableRegs._data[3] = 0;
        pFStack_90 = this;
        pcStack_80 = (code *)lVar22;
        EVar9 = RAConstraints::init(&RStack_5d0,(EVP_PKEY_CTX *)(ulong)frame->_arch);
        if (EVar9 == 0) {
          FuncArgsContext::FuncArgsContext(&FStack_5b8);
          EVar9 = FuncArgsContext::initWorkData(&FStack_5b8,frame,args,&RStack_5d0);
          if (((EVar9 == 0) &&
              (EVar9 = FuncArgsContext::markDstRegsDirty(&FStack_5b8,frame), EVar9 == 0)) &&
             (EVar9 = FuncArgsContext::markScratchRegs(&FStack_5b8,frame), EVar9 == 0)) {
            EVar9 = FuncArgsContext::markStackArgsReg(&FStack_5b8,frame);
          }
        }
        return EVar9;
      }
      return 3;
    }
    local_68 = _archTraits + lVar22;
    bVar14 = *pbVar10;
    local_70 = this->_attributes;
    local_77 = this->_minDynamicAlignment;
    bVar3 = *local_68;
    bVar16 = _archTraits[lVar22 + 1];
    bVar20 = bVar3;
    if ((local_70 & kHasPreservedFP) != kNoAttributes) {
      local_60 = (Array<asmjit::v1_14::InstHints,_4UL> *)CONCAT71(local_60._1_7_,bVar3);
      local_76[3] = 0;
      pcStack_80 = (code *)0x11ed13;
      puVar11 = Support::Array<unsigned_int,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                          (&this->_dirtyRegs,local_76 + 3);
      *puVar11 = *puVar11 | 1 << (bVar16 & 0x1f);
      bVar20 = (byte)local_60;
      if (bVar1 != 0xff) {
        local_76[2] = 0;
        pcStack_80 = (code *)0x11ed48;
        puVar11 = Support::Array<unsigned_int,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                            (&this->_dirtyRegs,local_76 + 2);
        *puVar11 = *puVar11 | 1 << (bVar1 & 0x1f);
        bVar20 = (byte)local_60;
      }
    }
    bVar1 = this->_saRegId;
    if (this->_saRegId == 0xff) {
      bVar1 = bVar3;
    }
    if (bVar1 != bVar3) {
      bVar16 = bVar1;
    }
    if (bVar2 < local_77) {
      bVar16 = bVar1;
    }
    if (bVar16 != bVar3) {
      local_76[1] = 0;
      pcStack_80 = (code *)0x11ed8e;
      puVar11 = Support::Array<unsigned_int,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                          (&this->_dirtyRegs,local_76 + 1);
      *puVar11 = *puVar11 | 1 << (bVar16 & 0x1f);
    }
    this->_spRegId = bVar20;
    this->_saRegId = bVar16;
    saveRestoreSizes[0] = 0;
    saveRestoreSizes[1] = 0;
    local_60 = (Array<asmjit::v1_14::InstHints,_4UL> *)(local_68 + 0x10);
    for (group = k0; group != kPC; group = group + kVec) {
      pcStack_80 = (code *)0x11edce;
      RVar5 = savedRegs(this,group);
      uVar6 = RVar5 - (RVar5 >> 1 & 0x55555555);
      uVar6 = (uVar6 >> 2 & 0x33333333) + (uVar6 & 0x33333333);
      pcStack_80 = (code *)0x11ee09;
      uVar7 = saveRestoreRegSize(this,group);
      pcStack_80 = (code *)0x11ee1a;
      uVar8 = saveRestoreAlignment(this,group);
      pcStack_80 = (code *)0x11ee3d;
      local_76[0] = group;
      pIVar12 = Support::Array<asmjit::v1_14::InstHints,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                          (local_60,local_76);
      saveRestoreSizes[(*pIVar12 & kPushPop) == kNoHints] =
           saveRestoreSizes[(*pIVar12 & kPushPop) == kNoHints] +
           (-uVar8 & (uVar7 * (((uVar6 >> 4) + uVar6 & 0xf0f0f0f) * 0x1010101 >> 0x18) + uVar8) - 1)
      ;
    }
    this->_pushPopSaveSize = (uint16_t)saveRestoreSizes[0];
    this->_extraRegSaveSize = (uint16_t)saveRestoreSizes[1];
    iVar15 = bVar2 - 1;
    uVar6 = -(uint)bVar2;
    uVar17 = this->_callStackSize + iVar15 & uVar6;
    this->_localStackOffset = uVar17;
    uVar7 = uVar17 + this->_localStackSize;
    if ((bVar14 <= bVar2) && ((uint16_t)saveRestoreSizes[1] != 0)) {
      *(undefined1 *)&this->_attributes = (char)this->_attributes | kAlignedVecSR;
      uVar7 = -(uint)bVar14 & (uVar7 + bVar14) - 1;
    }
    iVar21 = (int)frame;
    uVar13 = saveRestoreSizes[0] & 0xffff;
    this->_extraRegSaveOffset = uVar7;
    uVar7 = (saveRestoreSizes[1] & 0xffff) + uVar7;
    uVar19 = 0xffffffff;
    uVar17 = 0;
    uVar8 = uVar19;
    if ((local_70 & kHasPreservedFP) == kNoAttributes && local_77 <= bVar2) {
      uVar17 = local_6c;
      uVar8 = uVar7;
    }
    this->_daOffset = uVar8;
    iVar18 = uVar17 + uVar7;
    if (((iVar18 == 0) && ((this->_attributes & kHasFuncCalls) == kNoAttributes)) && (iVar21 != 0))
    {
      uVar7 = 0;
    }
    else {
      uVar7 = (iVar18 + uVar13 + iVar21 + iVar15 & uVar6) - (uVar13 + iVar21);
    }
    this->_pushPopSaveOffset = uVar7;
    this->_stackAdjustment = uVar7;
    this->_finalStackSize = uVar7 + uVar13;
    EVar9 = 0;
    uVar17 = 0;
    if (local_68[2] == 0xff) {
      uVar17 = local_6c;
    }
    if (bVar2 < local_77) {
      uVar19 = uVar17 + uVar7 + uVar13;
    }
    else {
      this->_stackAdjustment = uVar7 + iVar15 & uVar6;
    }
    this->_saOffsetFromSP = uVar19;
    if ((local_70 & kHasPreservedFP) == kNoAttributes) {
      local_6c = uVar13;
    }
    this->_saOffsetFromSA = local_6c + iVar21;
  }
  else {
    EVar9 = 4;
  }
  return EVar9;
}

Assistant:

ASMJIT_FAVOR_SIZE Error FuncFrame::finalize() noexcept {
  if (!Environment::isValidArch(arch()))
    return DebugUtils::errored(kErrorInvalidArch);

  const ArchTraits& archTraits = ArchTraits::byArch(arch());

  uint32_t registerSize = _saveRestoreRegSize[RegGroup::kGp];
  uint32_t vectorSize = _saveRestoreRegSize[RegGroup::kVec];
  uint32_t returnAddressSize = archTraits.hasLinkReg() ? 0u : registerSize;

  // The final stack alignment must be updated accordingly to call and local stack alignments.
  uint32_t stackAlignment = _finalStackAlignment;
  ASMJIT_ASSERT(stackAlignment == Support::max(_naturalStackAlignment,
                                               _callStackAlignment,
                                               _localStackAlignment));

  bool hasFP = hasPreservedFP();
  bool hasDA = hasDynamicAlignment();

  uint32_t kSp = archTraits.spRegId();
  uint32_t kFp = archTraits.fpRegId();
  uint32_t kLr = archTraits.linkRegId();

  // Make frame pointer dirty if the function uses it.
  if (hasFP) {
    _dirtyRegs[RegGroup::kGp] |= Support::bitMask(kFp);

    // Currently required by ARM, if this works differently across architectures we would have to generalize most
    // likely in CallConv.
    if (kLr != BaseReg::kIdBad)
      _dirtyRegs[RegGroup::kGp] |= Support::bitMask(kLr);
  }

  // These two are identical if the function doesn't align its stack dynamically.
  uint32_t saRegId = _saRegId;
  if (saRegId == BaseReg::kIdBad)
    saRegId = kSp;

  // Fix stack arguments base-register from SP to FP in case it was not picked before and the function performs
  // dynamic stack alignment.
  if (hasDA && saRegId == kSp)
    saRegId = kFp;

  // Mark as dirty any register but SP if used as SA pointer.
  if (saRegId != kSp)
    _dirtyRegs[RegGroup::kGp] |= Support::bitMask(saRegId);

  _spRegId = uint8_t(kSp);
  _saRegId = uint8_t(saRegId);

  // Setup stack size used to save preserved registers.
  uint32_t saveRestoreSizes[2] {};
  for (RegGroup group : RegGroupVirtValues{})
    saveRestoreSizes[size_t(!archTraits.hasInstPushPop(group))]
      += Support::alignUp(Support::popcnt(savedRegs(group)) * saveRestoreRegSize(group), saveRestoreAlignment(group));

  _pushPopSaveSize  = uint16_t(saveRestoreSizes[0]);
  _extraRegSaveSize = uint16_t(saveRestoreSizes[1]);

  uint32_t v = 0;                            // The beginning of the stack frame relative to SP after prolog.
  v += callStackSize();                      // Count 'callStackSize'      <- This is used to call functions.
  v  = Support::alignUp(v, stackAlignment);  // Align to function's stack alignment.

  _localStackOffset = v;                     // Store 'localStackOffset'   <- Function's local stack starts here.
  v += localStackSize();                     // Count 'localStackSize'     <- Function's local stack ends here.

  // If the function's stack must be aligned, calculate the alignment necessary to store vector registers, and set
  // `FuncAttributes::kAlignedVecSR` to inform PEI that it can use instructions that perform aligned stores/loads.
  if (stackAlignment >= vectorSize && _extraRegSaveSize) {
    addAttributes(FuncAttributes::kAlignedVecSR);
    v = Support::alignUp(v, vectorSize);     // Align 'extraRegSaveOffset'.
  }

  _extraRegSaveOffset = v;                   // Store 'extraRegSaveOffset' <- Non-GP save/restore starts here.
  v += _extraRegSaveSize;                    // Count 'extraRegSaveSize'   <- Non-GP save/restore ends here.

  // Calculate if dynamic alignment (DA) slot (stored as offset relative to SP) is required and its offset.
  if (hasDA && !hasFP) {
    _daOffset = v;                           // Store 'daOffset'           <- DA pointer would be stored here.
    v += registerSize;                       // Count 'daOffset'.
  }
  else {
    _daOffset = FuncFrame::kTagInvalidOffset;
  }

  // Link Register
  // -------------
  //
  // The stack is aligned after the function call as the return address is stored in a link register. Some
  // architectures may require to always have aligned stack after PUSH/POP operation, which is represented
  // by ArchTraits::stackAlignmentConstraint().
  //
  // No Link Register (X86/X64)
  // --------------------------
  //
  // The return address should be stored after GP save/restore regs. It has the same size as `registerSize`
  // (basically the native register/pointer size). We don't adjust it now as `v` now contains the exact size
  // that the function requires to adjust (call frame + stack frame, vec stack size). The stack (if we consider
  // this size) is misaligned now, as it's always aligned before the function call - when `call()` is executed
  // it pushes the current EIP|RIP onto the stack, and misaligns it by 12 or 8 bytes (depending on the
  // architecture). So count number of bytes needed to align it up to the function's CallFrame (the beginning).
  if (v || hasFuncCalls() || !returnAddressSize)
    v += Support::alignUpDiff(v + pushPopSaveSize() + returnAddressSize, stackAlignment);

  _pushPopSaveOffset = v;                    // Store 'pushPopSaveOffset'  <- Function's push/pop save/restore starts here.
  _stackAdjustment = v;                      // Store 'stackAdjustment'    <- SA used by 'add SP, SA' and 'sub SP, SA'.
  v += _pushPopSaveSize;                     // Count 'pushPopSaveSize'    <- Function's push/pop save/restore ends here.
  _finalStackSize = v;                       // Store 'finalStackSize'     <- Final stack used by the function.

  if (!archTraits.hasLinkReg())
    v += registerSize;                       // Count 'ReturnAddress'      <- As CALL pushes onto stack.

  // If the function performs dynamic stack alignment then the stack-adjustment must be aligned.
  if (hasDA)
    _stackAdjustment = Support::alignUp(_stackAdjustment, stackAlignment);

  // Calculate where the function arguments start relative to SP.
  _saOffsetFromSP = hasDA ? FuncFrame::kTagInvalidOffset : v;

  // Calculate where the function arguments start relative to FP or user-provided register.
  _saOffsetFromSA = hasFP ? returnAddressSize + registerSize      // Return address + frame pointer.
                          : returnAddressSize + _pushPopSaveSize; // Return address + all push/pop regs.

  return kErrorOk;
}